

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

void __thiscall cmCTestRunTest::StartFailure(cmCTestRunTest *this,string *output,string *detail)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  uint uVar5;
  long lVar6;
  ostringstream cmCTestLog_msg;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  bVar2 = cmCTest::GetTestProgressOutput(this->CTest);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    uVar3 = 10;
    if (9 < this->TotalNumberOfTests) {
      uVar5 = 10;
      uVar3 = this->TotalNumberOfTests;
      do {
        uVar5 = uVar5 + 2;
        bVar2 = 99 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar2);
      uVar3 = (ulong)uVar5;
    }
    *(ulong *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x10)) = uVar3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Start ",6);
    uVar3 = (ulong)this->TestHandler->MaxIndex;
    lVar6 = 1;
    if (9 < uVar3) {
      do {
        lVar6 = lVar6 + 1;
        bVar2 = 99 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar2);
    }
    *(long *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x10)) = lVar6;
    poVar4 = (ostream *)std::ostream::operator<<(local_1a0,this->TestProperties->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->TestProperties->Name)._M_dataplus._M_p,
                        (this->TestProperties->Name)._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1c6,(char *)local_1c0,false);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  if (output->_M_string_length != 0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->TestHandler->LogFile,(output->_M_dataplus)._M_p,
                        output->_M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(output->_M_dataplus)._M_p,output->_M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1cc,(char *)local_1c0,false);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  (this->TestResult).Properties = this->TestProperties;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).CompletionStatus);
  (this->TestResult).Status = 0;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
  (this->TestResult).FullCommandLine._M_string_length = 0;
  *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
  (this->TestResult).Environment._M_string_length = 0;
  *(this->TestResult).Environment._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void cmCTestRunTest::StartFailure(std::string const& output,
                                  std::string const& detail)
{
  // Still need to log the Start message so the test summary records our
  // attempt to start this test
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(this->TotalNumberOfTests) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  }

  this->ProcessOutput.clear();
  if (!output.empty()) {
    *this->TestHandler->LogFile << output << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, output << std::endl);
  }

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = detail;
  this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;
  this->TestResult.Output = output;
  this->TestResult.FullCommandLine.clear();
  this->TestResult.Environment.clear();
}